

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_lazy2_dictMatchState_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  int iVar3;
  char cVar4;
  undefined8 uVar5;
  uint uVar6;
  U32 UVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  seqDef *psVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  int *piVar14;
  long lVar15;
  int *piVar16;
  int *piVar17;
  ulong uVar18;
  uint uVar19;
  U32 UVar20;
  ulong uVar21;
  ulong uVar22;
  BYTE *litEnd_1;
  seqStore_t *psVar23;
  BYTE *litEnd;
  BYTE *pBVar24;
  size_t offbaseFound;
  BYTE *litLimit_w;
  size_t local_d0;
  ZSTD_matchState_t *local_c8;
  U32 local_c0;
  uint local_bc;
  U32 local_b8;
  uint local_b4;
  BYTE *local_b0;
  ulong local_a8;
  ulong local_a0;
  int *local_98;
  int *local_90;
  uint local_84;
  BYTE *local_80;
  BYTE *local_78;
  BYTE *local_70;
  uint local_64;
  BYTE *local_60;
  int *local_58;
  BYTE *local_50;
  seqStore_t *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  local_b0 = (ms->window).base;
  local_84 = (ms->window).dictLimit;
  local_a8 = (ulong)local_84;
  local_70 = local_b0 + local_a8;
  local_b4 = (ms->cParams).minMatch;
  if (5 < local_b4) {
    local_b4 = 6;
  }
  if (local_b4 < 5) {
    local_b4 = 4;
  }
  local_64 = (ms->cParams).searchLog;
  local_bc = 6;
  if (local_64 < 6) {
    local_bc = local_64;
  }
  if (local_bc < 5) {
    local_bc = 4;
  }
  pZVar2 = ms->dictMatchState;
  local_60 = (pZVar2->window).base;
  local_38 = local_60 + (pZVar2->window).dictLimit;
  local_78 = (pZVar2->window).nextSrc;
  piVar16 = (int *)((ulong)(((int)src - ((int)local_70 + (int)local_38)) + (int)local_78 == 0) +
                   (long)src);
  local_c0 = *rep;
  local_b8 = rep[1];
  ms->lazySkipping = 0;
  local_98 = (int *)((long)src + (srcSize - 0x10));
  uVar8 = ms->nextToUpdate;
  uVar18 = (ulong)uVar8;
  uVar19 = ((int)local_98 - (int)(local_b0 + uVar18)) + 1;
  uVar6 = 8;
  if (uVar19 < 8) {
    uVar6 = uVar19;
  }
  if (local_98 < local_b0 + uVar18) {
    uVar6 = 0;
  }
  if (uVar8 < uVar6 + uVar8) {
    uVar10 = ms->hashSalt;
    cVar4 = (char)ms->rowHashLog;
    do {
      if (local_b4 == 5) {
        uVar21 = *(long *)(local_b0 + uVar18) * -0x30e4432345000000;
LAB_01d39319:
        UVar20 = (U32)((uVar21 ^ uVar10) >> (0x38U - cVar4 & 0x3f));
      }
      else {
        if (local_b4 == 6) {
          uVar21 = *(long *)(local_b0 + uVar18) * -0x30e4432340650000;
          goto LAB_01d39319;
        }
        UVar20 = (*(int *)(local_b0 + uVar18) * -0x61c8864f ^ (uint)uVar10) >>
                 (0x18U - cVar4 & 0x1f);
      }
      ms->hashCache[(uint)uVar18 & 7] = UVar20;
      uVar18 = uVar18 + 1;
    } while (uVar6 + uVar8 != uVar18);
  }
  pBVar24 = (BYTE *)(srcSize + (long)src);
  local_40 = rep;
  if (piVar16 < local_98) {
    local_84 = ((int)local_60 - (int)local_78) + local_84;
    local_50 = local_60 + -(ulong)local_84;
    local_58 = (int *)(pBVar24 + -0x20);
    local_c8 = ms;
    local_80 = pBVar24;
    local_48 = seqStore;
    do {
      uVar8 = local_b4;
      piVar14 = (int *)((long)piVar16 + 1);
      uVar6 = (((int)piVar16 - (int)local_b0) - local_c0) + 1;
      piVar17 = (int *)(local_b0 + uVar6);
      if (uVar6 < (uint)local_a8) {
        piVar17 = (int *)(local_60 + (uVar6 - local_84));
      }
      if ((uVar6 - (uint)local_a8 < 0xfffffffd) && (*piVar17 == *piVar14)) {
        pBVar13 = pBVar24;
        if (uVar6 < (uint)local_a8) {
          pBVar13 = local_78;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar16 + 5),(BYTE *)(piVar17 + 1),pBVar24,pBVar13,
                           local_70);
        uVar18 = sVar9 + 4;
      }
      else {
        uVar18 = 0;
      }
      local_d0 = 999999999;
      local_90 = piVar14;
      if (uVar8 == 6) {
        if (local_bc == 6) {
          uVar10 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                             (local_c8,(BYTE *)piVar16,pBVar24,&local_d0);
        }
        else if (local_bc == 5) {
          uVar10 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                             (local_c8,(BYTE *)piVar16,pBVar24,&local_d0);
        }
        else {
          uVar10 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                             (local_c8,(BYTE *)piVar16,pBVar24,&local_d0);
        }
      }
      else if (uVar8 == 5) {
        if (local_bc == 6) {
          uVar10 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                             (local_c8,(BYTE *)piVar16,pBVar24,&local_d0);
        }
        else if (local_bc == 5) {
          uVar10 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                             (local_c8,(BYTE *)piVar16,pBVar24,&local_d0);
        }
        else {
          uVar10 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                             (local_c8,(BYTE *)piVar16,pBVar24,&local_d0);
        }
      }
      else if (local_bc == 6) {
        uVar10 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                           (local_c8,(BYTE *)piVar16,pBVar24,&local_d0);
      }
      else if (local_bc == 5) {
        uVar10 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                           (local_c8,(BYTE *)piVar16,pBVar24,&local_d0);
      }
      else {
        uVar10 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                           (local_c8,(BYTE *)piVar16,pBVar24,&local_d0);
      }
      uVar21 = uVar18;
      if (uVar18 < uVar10) {
        uVar21 = uVar10;
      }
      if (uVar21 < 4) {
        local_c8->lazySkipping = (uint)(0x7ff < (ulong)((long)piVar16 - (long)src));
        piVar16 = (int *)((long)piVar16 + ((ulong)((long)piVar16 - (long)src) >> 8) + 1);
        UVar20 = local_b8;
      }
      else {
        piVar14 = piVar16;
        local_a0 = local_d0;
        if (uVar10 <= uVar18) {
          local_a0 = 1;
          piVar14 = local_90;
        }
        local_90 = piVar14;
        if (piVar16 < local_98) {
          do {
            pBVar24 = local_80;
            uVar8 = local_b4;
            piVar14 = (int *)((long)piVar16 + 1);
            uVar6 = ((int)piVar14 - (int)local_b0) - local_c0;
            piVar17 = (int *)(local_b0 + uVar6);
            if (uVar6 < (uint)local_a8) {
              piVar17 = (int *)(local_60 + (uVar6 - local_84));
            }
            if ((uVar6 - (uint)local_a8 < 0xfffffffd) && (*piVar17 == *piVar14)) {
              pBVar13 = local_80;
              if (uVar6 < (uint)local_a8) {
                pBVar13 = local_78;
              }
              sVar9 = ZSTD_count_2segments
                                ((BYTE *)((long)piVar16 + 5),(BYTE *)(piVar17 + 1),local_80,pBVar13,
                                 local_70);
              if (sVar9 < 0xfffffffffffffffc) {
                uVar6 = 0x1f;
                if ((uint)local_a0 != 0) {
                  for (; (uint)local_a0 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                  }
                }
                if ((int)((uVar6 ^ 0x1f) + (int)uVar21 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
                  local_a0 = 1;
                  uVar21 = sVar9 + 4;
                  local_90 = piVar14;
                }
              }
            }
            local_d0 = 999999999;
            if (uVar8 == 6) {
              if (local_bc == 6) {
                uVar18 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                                   (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
              }
              else if (local_bc == 5) {
                uVar18 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                                   (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
              }
              else {
                uVar18 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                                   (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
              }
            }
            else if (uVar8 == 5) {
              if (local_bc == 6) {
                uVar18 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                                   (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
              }
              else if (local_bc == 5) {
                uVar18 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                                   (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
              }
              else {
                uVar18 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                                   (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
              }
            }
            else if (local_bc == 6) {
              uVar18 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                                 (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
            }
            else if (local_bc == 5) {
              uVar18 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                                 (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
            }
            else {
              uVar18 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                                 (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
            }
            pBVar24 = local_80;
            uVar8 = local_b4;
            if (uVar18 < 4) {
LAB_01d3974c:
              if (local_98 <= piVar14) break;
              piVar14 = (int *)((long)piVar16 + 2);
              uVar6 = ((int)piVar14 - (int)local_b0) - local_c0;
              piVar17 = (int *)(local_b0 + uVar6);
              if (uVar6 < (uint)local_a8) {
                piVar17 = (int *)(local_60 + (uVar6 - local_84));
              }
              if ((uVar6 - (uint)local_a8 < 0xfffffffd) && (*piVar17 == *piVar14)) {
                pBVar13 = local_80;
                if (uVar6 < (uint)local_a8) {
                  pBVar13 = local_78;
                }
                sVar9 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar16 + 6),(BYTE *)(piVar17 + 1),local_80,
                                   pBVar13,local_70);
                if (sVar9 < 0xfffffffffffffffc) {
                  uVar6 = 0x1f;
                  if ((uint)local_a0 != 0) {
                    for (; (uint)local_a0 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                    }
                  }
                  if ((int)((uVar6 ^ 0x1f) + (int)uVar21 * 4 + -0x1e) < (int)(sVar9 + 4) * 4) {
                    local_a0 = 1;
                    uVar21 = sVar9 + 4;
                    local_90 = piVar14;
                  }
                }
              }
              local_d0 = 999999999;
              if (uVar8 == 6) {
                if (local_bc == 6) {
                  uVar18 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                                     (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
                }
                else if (local_bc == 5) {
                  uVar18 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                                     (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
                }
                else {
                  uVar18 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                                     (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
                }
              }
              else if (uVar8 == 5) {
                if (local_bc == 6) {
                  uVar18 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                                     (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
                }
                else if (local_bc == 5) {
                  uVar18 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                                     (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
                }
                else {
                  uVar18 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                                     (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
                }
              }
              else if (local_bc == 6) {
                uVar18 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                                   (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
              }
              else if (local_bc == 5) {
                uVar18 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                                   (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
              }
              else {
                uVar18 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                                   (local_c8,(BYTE *)piVar14,pBVar24,&local_d0);
              }
              if (uVar18 < 4) break;
              uVar8 = 0x1f;
              if ((uint)local_a0 != 0) {
                for (; (uint)local_a0 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              iVar3 = 0x1f;
              if ((uint)local_d0 != 0) {
                for (; (uint)local_d0 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              if ((int)uVar18 * 4 - iVar3 <= (int)((uVar8 ^ 0x1f) + (int)uVar21 * 4 + -0x18)) break;
            }
            else {
              uVar6 = 0x1f;
              if ((uint)local_a0 != 0) {
                for (; (uint)local_a0 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              iVar3 = 0x1f;
              if ((uint)local_d0 != 0) {
                for (; (uint)local_d0 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              if ((int)uVar18 * 4 - iVar3 <= (int)((uVar6 ^ 0x1f) + (int)uVar21 * 4 + -0x1b))
              goto LAB_01d3974c;
            }
            uVar21 = uVar18;
            piVar16 = piVar14;
            local_a0 = local_d0;
            local_90 = piVar16;
          } while (piVar16 < local_98);
        }
        psVar23 = local_48;
        UVar20 = (U32)local_a0;
        piVar16 = local_90;
        if (3 < local_a0) {
          pBVar12 = (BYTE *)((long)local_90 + (-(long)local_b0 - local_a0) + -0xfffffffd);
          pBVar13 = local_b0;
          pBVar24 = local_70;
          if ((uint)pBVar12 < (uint)local_a8) {
            pBVar13 = local_50;
            pBVar24 = local_38;
          }
          if ((src < local_90) && (uVar18 = (ulong)pBVar12 & 0xffffffff, pBVar24 < pBVar13 + uVar18)
             ) {
            pBVar13 = pBVar13 + uVar18;
            do {
              piVar14 = (int *)((long)piVar16 + -1);
              pBVar13 = pBVar13 + -1;
              if ((*(BYTE *)piVar14 != *pBVar13) ||
                 (uVar21 = uVar21 + 1, piVar16 = piVar14, piVar14 <= src)) break;
            } while (pBVar24 < pBVar13);
          }
          local_b8 = local_c0;
          local_c0 = UVar20 - 3;
        }
        uVar18 = (long)piVar16 - (long)src;
        pBVar24 = local_48->lit;
        if (local_58 < piVar16) {
          ZSTD_safecopyLiterals(pBVar24,(BYTE *)src,(BYTE *)piVar16,(BYTE *)local_58);
LAB_01d39a45:
          psVar23->lit = psVar23->lit + uVar18;
          psVar11 = psVar23->sequences;
          if (0xffff < uVar18) {
            psVar23->longLengthType = ZSTD_llt_literalLength;
            psVar23->longLengthPos =
                 (U32)((ulong)((long)psVar11 - (long)psVar23->sequencesStart) >> 3);
          }
        }
        else {
          uVar5 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar24 = *src;
          *(undefined8 *)(pBVar24 + 8) = uVar5;
          pBVar24 = local_48->lit;
          if (0x10 < uVar18) {
            uVar5 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar24 + 0x18) = uVar5;
            if (0x20 < (long)uVar18) {
              lVar15 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar15 + 0x20);
                uVar5 = puVar1[1];
                pBVar13 = pBVar24 + lVar15 + 0x20;
                *(undefined8 *)pBVar13 = *puVar1;
                *(undefined8 *)(pBVar13 + 8) = uVar5;
                puVar1 = (undefined8 *)((long)src + lVar15 + 0x30);
                uVar5 = puVar1[1];
                *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar13 + 0x18) = uVar5;
                lVar15 = lVar15 + 0x20;
              } while (pBVar13 + 0x20 < pBVar24 + uVar18);
            }
            goto LAB_01d39a45;
          }
          local_48->lit = pBVar24 + uVar18;
          psVar11 = local_48->sequences;
        }
        pBVar24 = local_80;
        psVar11->litLength = (U16)uVar18;
        psVar11->offBase = UVar20;
        if (0xffff < uVar21 - 3) {
          psVar23->longLengthType = ZSTD_llt_matchLength;
          psVar23->longLengthPos =
               (U32)((ulong)((long)psVar11 - (long)psVar23->sequencesStart) >> 3);
        }
        psVar11->mlBase = (U16)(uVar21 - 3);
        psVar23->sequences = psVar11 + 1;
        if (local_c8->lazySkipping != 0) {
          uVar8 = local_c8->nextToUpdate;
          uVar18 = (ulong)uVar8;
          uVar6 = ((int)local_98 - (int)(local_b0 + uVar18)) + 1;
          if (7 < uVar6) {
            uVar6 = 8;
          }
          if (local_98 < local_b0 + uVar18) {
            uVar6 = 0;
          }
          if (uVar8 < uVar6 + uVar8) {
            uVar10 = local_c8->hashSalt;
            cVar4 = (char)local_c8->rowHashLog;
            do {
              if (local_b4 == 5) {
                uVar22 = *(long *)(local_b0 + uVar18) * -0x30e4432345000000;
LAB_01d39bc2:
                UVar20 = (U32)((uVar22 ^ uVar10) >> (0x38U - cVar4 & 0x3f));
              }
              else {
                if (local_b4 == 6) {
                  uVar22 = *(long *)(local_b0 + uVar18) * -0x30e4432340650000;
                  goto LAB_01d39bc2;
                }
                UVar20 = (*(int *)(local_b0 + uVar18) * -0x61c8864f ^ (uint)uVar10) >>
                         (0x18U - cVar4 & 0x1f);
              }
              if (4 < local_64) {
                psVar23 = local_48;
              }
              local_c8->hashCache[(uint)uVar18 & 7] = UVar20;
              uVar18 = uVar18 + 1;
            } while (uVar6 + uVar8 != uVar18);
          }
          local_c8->lazySkipping = 0;
        }
        src = (void *)((long)piVar16 + uVar21);
        piVar16 = (int *)src;
        UVar20 = local_b8;
        if (src <= local_98) {
          do {
            UVar7 = local_c0;
            uVar8 = ((int)src - (int)local_b0) - UVar20;
            pBVar13 = local_b0;
            if (uVar8 < (uint)local_a8) {
              pBVar13 = local_50;
            }
            piVar16 = (int *)src;
            local_c0 = UVar7;
            if ((0xfffffffc < uVar8 - (uint)local_a8) || (*(int *)(pBVar13 + uVar8) != *src)) break;
            pBVar12 = pBVar24;
            if (uVar8 < (uint)local_a8) {
              pBVar12 = local_78;
            }
            local_c0 = UVar20;
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar13 + uVar8) + 4),pBVar24
                               ,pBVar12,local_70);
            pBVar13 = psVar23->lit;
            if (local_58 < src) {
              ZSTD_safecopyLiterals(pBVar13,(BYTE *)src,(BYTE *)src,(BYTE *)local_58);
            }
            else {
              uVar5 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar13 = *src;
              *(undefined8 *)(pBVar13 + 8) = uVar5;
            }
            psVar11 = psVar23->sequences;
            psVar11->litLength = 0;
            psVar11->offBase = 1;
            if (0xffff < sVar9 + 1) {
              psVar23->longLengthType = ZSTD_llt_matchLength;
              psVar23->longLengthPos =
                   (U32)((ulong)((long)psVar11 - (long)psVar23->sequencesStart) >> 3);
            }
            psVar11->mlBase = (U16)(sVar9 + 1);
            psVar23->sequences = psVar11 + 1;
            src = (void *)((long)src + sVar9 + 4);
            piVar16 = (int *)src;
            UVar20 = UVar7;
          } while (src <= local_98);
        }
      }
      local_b8 = UVar20;
    } while (piVar16 < local_98);
  }
  *local_40 = local_c0;
  local_40[1] = local_b8;
  return (long)pBVar24 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_dictMatchState_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2, ZSTD_dictMatchState);
}